

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
          (ByteData *this,ByteData *top,ByteData *args,ByteData *args_1)

{
  ByteData *in_RCX;
  ByteData *in_RDX;
  ByteData *in_RDI;
  ByteData *in_R8;
  ByteData *in_stack_00000020;
  ByteData result;
  
  Concat<cfd::core::ByteData>
            ((ByteData *)
             result.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,in_stack_00000020);
  Concat<cfd::core::ByteData,cfd::core::ByteData>(in_RDX,in_RCX,in_R8);
  ~ByteData((ByteData *)0x4047f7);
  return in_RDI;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }